

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O1

char * unescape_word(char *input)

{
  CURLcode CVar1;
  char *pcVar2;
  byte bVar3;
  dynbuf out;
  dynbuf dStack_48;
  
  Curl_dyn_init(&dStack_48,10000);
  bVar3 = *input;
  if (bVar3 != 0) {
    CVar1 = CURLE_OK;
    do {
      if (((byte)(bVar3 + 0x81) < 0xa2) ||
         ((bVar3 - 0x22 < 0x3b && ((0x400000000000021U >> ((ulong)(bVar3 - 0x22) & 0x3f) & 1) != 0))
         )) {
        CVar1 = Curl_dyn_addn(&dStack_48,"\\",1);
      }
      if (CVar1 == CURLE_OK) {
        CVar1 = Curl_dyn_addn(&dStack_48,input,1);
      }
      if (CVar1 != CURLE_OK) {
        return (char *)0x0;
      }
      bVar3 = input[1];
      input = input + 1;
    } while (bVar3 != 0);
  }
  pcVar2 = Curl_dyn_ptr(&dStack_48);
  return pcVar2;
}

Assistant:

static char *unescape_word(const char *input)
{
  struct dynbuf out;
  const char *ptr;
  CURLcode result = CURLE_OK;
  Curl_dyn_init(&out, DYN_DICT_WORD);

  /* According to RFC2229 section 2.2, these letters need to be escaped with
     \[letter] */
  for(ptr = input; *ptr; ptr++) {
    char ch = *ptr;
    if((ch <= 32) || (ch == 127) ||
       (ch == '\'') || (ch == '\"') || (ch == '\\'))
      result = Curl_dyn_addn(&out, "\\", 1);
    if(!result)
      result = Curl_dyn_addn(&out, ptr, 1);
    if(result)
      return NULL;
  }
  return Curl_dyn_ptr(&out);
}